

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O2

void __thiscall PlanningUnitMADPDiscrete::InitializeActionHistories(PlanningUnitMADPDiscrete *this)

{
  pointer puVar1;
  undefined1 auVar2 [16];
  int iVar3;
  undefined4 extraout_var;
  _Vector_base<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_> *this_00;
  undefined4 extraout_var_00;
  undefined8 uVar4;
  Index t;
  ulong uVar5;
  Index i;
  ulong uVar6;
  undefined1 auVar7 [64];
  undefined8 extraout_XMM1_Qa;
  undefined1 extraout_var_02 [56];
  undefined1 in_XMM2 [16];
  size_t total;
  ActionHistoryTree *treeThiAg;
  ActionHistoryTree *pAStack_80;
  pointer local_78;
  vector<std::vector<unsigned_long_long,std::allocator<unsigned_long_long>>,std::allocator<std::vector<unsigned_long_long,std::allocator<unsigned_long_long>>>>
  *local_70;
  vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
  *local_68;
  vector<std::vector<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>,_std::allocator<std::vector<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>_>_>
  *local_60;
  double local_58;
  size_t oh_this_t;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> firstAHindex_per_t;
  undefined1 extraout_var_01 [56];
  undefined1 auVar8 [64];
  
  if ((this->_m_params)._m_individualActionHistories == true) {
    iVar3 = (*(this->super_PlanningUnit)._vptr_PlanningUnit[6])(this);
    local_58 = (double)CONCAT44(extraout_var,iVar3);
    local_60 = &this->_m_actionHistoryTreeVectors;
    local_68 = (vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                *)&this->_m_nrActionHistoriesT;
    local_70 = (vector<std::vector<unsigned_long_long,std::allocator<unsigned_long_long>>,std::allocator<std::vector<unsigned_long_long,std::allocator<unsigned_long_long>>>>
                *)&this->_m_firstAHIforT;
    for (uVar6 = 0; uVar6 < (ulong)local_58; uVar6 = (ulong)((Index)uVar6 + 1)) {
      this_00 = (_Vector_base<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>
                 *)operator_new(0x18);
      (this_00->_M_impl).super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (this_00->_M_impl).super__Vector_impl_data._M_start = (pointer)0x0;
      (this_00->_M_impl).super__Vector_impl_data._M_finish = (pointer)0x0;
      std::
      vector<std::vector<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>,_std::allocator<std::vector<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>_>_>
      ::push_back(local_60,(value_type *)this_00);
      local_78 = (pointer)0x0;
      treeThiAg = (ActionHistoryTree *)0x0;
      pAStack_80 = (ActionHistoryTree *)0x0;
      std::
      vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
      ::emplace_back<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                (local_68,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&treeThiAg);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&treeThiAg);
      local_78 = (pointer)0x0;
      treeThiAg = (ActionHistoryTree *)0x0;
      pAStack_80 = (ActionHistoryTree *)0x0;
      std::
      vector<std::vector<unsigned_long_long,std::allocator<unsigned_long_long>>,std::allocator<std::vector<unsigned_long_long,std::allocator<unsigned_long_long>>>>
      ::emplace_back<std::vector<unsigned_long_long,std::allocator<unsigned_long_long>>>
                (local_70,(vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
                          &treeThiAg);
      std::_Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)&treeThiAg
                );
      std::_Vector_base<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>::
      ~_Vector_base(this_00);
      operator_delete(this_00,0x18);
      treeThiAg = CreateActionHistoryTree(this,(Index)uVar6);
      std::vector<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>::push_back
                (&this->_m_actionHistoryTreeRootPointers,(value_type *)&treeThiAg);
    }
  }
  else {
    puVar1 = (this->_m_nrActionHistories).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->_m_nrActionHistories).
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish != puVar1) {
      (this->_m_nrActionHistories).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
      ._M_impl.super__Vector_impl_data._M_finish = puVar1;
    }
    local_70 = (vector<std::vector<unsigned_long_long,std::allocator<unsigned_long_long>>,std::allocator<std::vector<unsigned_long_long,std::allocator<unsigned_long_long>>>>
                *)&this->_m_nrActionHistoriesT;
    local_68 = (vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                *)&this->_m_nrActionHistories;
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::clear((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)local_70);
    local_60 = (vector<std::vector<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>,_std::allocator<std::vector<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>_>_>
                *)&this->_m_firstAHIforT;
    std::
    vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
    ::clear((vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
             *)local_60);
    uVar6 = 0;
    local_78 = (pointer)0x0;
    firstAHindex_per_t.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    total = 0;
    treeThiAg = (ActionHistoryTree *)0x0;
    pAStack_80 = (ActionHistoryTree *)0x0;
    firstAHindex_per_t.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    firstAHindex_per_t.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    while( true ) {
      iVar3 = (*(this->super_PlanningUnit)._vptr_PlanningUnit[6])(this);
      if (CONCAT44(extraout_var_00,iVar3) <= uVar6) break;
      uVar4 = (**(code **)((long)*this->_m_madp + 0x60))(this->_m_madp,uVar6);
      auVar8._8_56_ = extraout_var_02;
      auVar8._0_8_ = extraout_XMM1_Qa;
      if (pAStack_80 != treeThiAg) {
        pAStack_80 = treeThiAg;
      }
      if (firstAHindex_per_t.
          super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          firstAHindex_per_t.
          super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
          super__Vector_impl_data._M_start) {
        firstAHindex_per_t.
        super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             firstAHindex_per_t.
             super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
      total = 0;
      auVar2 = vcvtusi2sd_avx512f(auVar8._0_16_,uVar4);
      local_58 = auVar2._0_8_;
      for (uVar5 = 0; uVar5 < (this->super_PlanningUnit)._m_horizon; uVar5 = (ulong)((int)uVar5 + 1)
          ) {
        oh_this_t = total;
        std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::
        emplace_back<unsigned_long_long>(&firstAHindex_per_t,&oh_this_t);
        auVar2 = vcvtusi2sd_avx512f(in_XMM2,(int)uVar5);
        auVar7._0_8_ = pow(local_58,auVar2._0_8_);
        auVar7._8_56_ = extraout_var_01;
        oh_this_t = vcvttsd2usi_avx512f(auVar7._0_16_);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&treeThiAg,&oh_this_t);
        total = total + oh_this_t;
      }
      std::
      vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
      ::push_back((vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                   *)local_60,&firstAHindex_per_t);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_68,&total);
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::push_back((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   *)local_70,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&treeThiAg);
      uVar6 = (ulong)((int)uVar6 + 1);
    }
    std::_Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>::~_Vector_base
              (&firstAHindex_per_t.
                super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&treeThiAg);
  }
  return;
}

Assistant:

void PlanningUnitMADPDiscrete::InitializeActionHistories()
{
    if(_m_params.GetComputeIndividualActionHistories())
    {
        size_t nrAgents=GetNrAgents();
        for(Index i = 0; i < nrAgents; i++)
        {
            vector<ActionHistoryTree*> * temp = new 
                vector<ActionHistoryTree*>;
            _m_actionHistoryTreeVectors.push_back(* temp );
            _m_nrActionHistoriesT.push_back(vector<size_t>());
            _m_firstAHIforT.push_back(vector<LIndex>());
            delete temp; // temp is copied into the vector - so delete this imm.
            ActionHistoryTree* treeThiAg = CreateActionHistoryTree(i);
            _m_actionHistoryTreeRootPointers.push_back(treeThiAg);
        }
    }
    else
    {
        /*Calculates the number of individual action histories and
         * stores this in _m_nrActionHistories (and 
         * _m_nrActionHistoriesT).
         * Only used when the Action histories are not created.
         */
        _m_nrActionHistories.clear();
        _m_nrActionHistoriesT.clear();
        _m_firstAHIforT.clear();
        vector<size_t> oh_per_t;
        vector<LIndex> firstAHindex_per_t;
        size_t total = 0;
        for(Index i=0; i < GetNrAgents(); i++)
        {
            size_t nrAi = GetMADPDI()->GetNrActions(i);
            oh_per_t.clear();
            firstAHindex_per_t.clear();
            total = 0;
            for(Index t=0; t < GetHorizon(); t++)
            {
                firstAHindex_per_t.push_back(total);
                size_t oh_this_t = (size_t) pow( (double)nrAi, (double)t );
                oh_per_t.push_back(oh_this_t);
                total += oh_this_t;
            }
            _m_firstAHIforT.push_back(firstAHindex_per_t);
            _m_nrActionHistories.push_back(total);
            _m_nrActionHistoriesT.push_back(oh_per_t);
        }
    }
}